

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitConditionalExpression
          (SyntaxDumper *this,ConditionalExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  ConditionalExpressionSyntax local_98 [72];
  ConditionalExpressionSyntax local_50 [56];
  ConditionalExpressionSyntax *local_18;
  ConditionalExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ConditionalExpressionSyntax *)this;
  pEVar1 = ConditionalExpressionSyntax::condition(node);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  ConditionalExpressionSyntax::questionToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  pEVar1 = ConditionalExpressionSyntax::whenTrue(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  ConditionalExpressionSyntax::colonToken(local_98);
  (**(code **)(*(long *)this + 0x2e8))(this,local_98,local_18);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_98);
  pEVar1 = ConditionalExpressionSyntax::whenFalse(local_18);
  (**(code **)(*(long *)this + 0x2f0))(this,pEVar1);
  return Skip;
}

Assistant:

virtual Action visitConditionalExpression(const ConditionalExpressionSyntax* node) override
    {
        nonterminal(node->condition());
        terminal(node->questionToken(), node);
        nonterminal(node->whenTrue());
        terminal(node->colonToken(), node);
        nonterminal(node->whenFalse());
        return Action::Skip;
    }